

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

void Cbs2_QuePush(Cbs2_Que_t *p,int iObj)

{
  int *piVar1;
  int iVar2;
  
  iVar2 = p->iTail;
  if (iVar2 == p->nSize) {
    p->nSize = iVar2 * 2;
    if (p->pData == (int *)0x0) {
      piVar1 = (int *)malloc((long)iVar2 << 3);
    }
    else {
      piVar1 = (int *)realloc(p->pData,(long)iVar2 << 3);
      iVar2 = p->iTail;
    }
    p->pData = piVar1;
  }
  else {
    piVar1 = p->pData;
  }
  p->iTail = iVar2 + 1;
  piVar1[iVar2] = iObj;
  return;
}

Assistant:

static inline void Cbs2_QuePush( Cbs2_Que_t * p, int iObj )
{
    if ( p->iTail == p->nSize )
    {
        p->nSize *= 2;
        p->pData = ABC_REALLOC( int, p->pData, p->nSize ); 
    }
    p->pData[p->iTail++] = iObj;
}